

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

double __thiscall mp::NLModel::ComputeObjValue(NLModel *this,double *x)

{
  int iVar1;
  long in_RSI;
  NLModel *in_RDI;
  size_t pos;
  int i_1;
  size_t pos_end;
  int i;
  double result;
  size_t local_38;
  int local_2c;
  size_t local_28;
  int local_1c;
  double local_18;
  
  local_18 = in_RDI->obj_c0_;
  local_1c = NumCols(in_RDI);
  while (iVar1 = local_1c + -1, local_1c != 0) {
    local_18 = in_RDI->obj_c_[iVar1] * *(double *)(in_RSI + (long)iVar1 * 8) + local_18;
    local_1c = iVar1;
  }
  if ((in_RDI->Q_).num_nz_ != 0) {
    local_28 = (in_RDI->Q_).num_nz_;
    local_2c = NumCols(in_RDI);
    while (iVar1 = local_2c + -1, local_2c != 0) {
      for (local_38 = (in_RDI->Q_).start_[iVar1]; local_38 != local_28; local_38 = local_38 + 1) {
        local_18 = (in_RDI->Q_).value_[local_38] * 0.5 * *(double *)(in_RSI + (long)iVar1 * 8) *
                   *(double *)(in_RSI + (long)(in_RDI->Q_).index_[local_38] * 8) + local_18;
      }
      local_28 = (in_RDI->Q_).start_[iVar1];
      local_2c = iVar1;
    }
  }
  return local_18;
}

Assistant:

double NLModel::ComputeObjValue(const double *x) const {
  double result {obj_c0_};
  for (auto i=NumCols(); i--; )
    result += obj_c_[i] * x[i];
  if (Q_.num_nz_) {
    auto pos_end = Q_.num_nz_;
    for (auto i=NumCols(); i--; ) {
      for (auto pos=Q_.start_[i]; pos!=pos_end; ++pos) {
        result
            += 0.5 * Q_.value_[pos] * x[i] * x[Q_.index_[pos]];
      }
      pos_end = Q_.start_[i];
    }
  }
  return result;
}